

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackTraceGnu-inl.cpp
# Opt level: O0

StackFrame * __thiscall
cppassert::internal::StackTraceImpl::at(StackTraceImpl *this,size_t position)

{
  ostream *poVar1;
  size_t sVar2;
  out_of_range *this_00;
  string local_1d0 [48];
  stringstream local_1a0 [8];
  stringstream msg;
  ostream local_190 [376];
  size_t local_18;
  size_t position_local;
  StackTraceImpl *this_local;
  
  if (position < this->backtraceSize_ - 2) {
    return this->frames_ + position;
  }
  local_18 = position;
  position_local = (size_t)this;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"StackFrame::at: Position ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18);
  poVar1 = std::operator<<(poVar1," is out of range: 0 and ");
  sVar2 = size(this);
  std::ostream::operator<<(poVar1,sVar2);
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringstream::str();
  std::out_of_range::out_of_range(this_00,local_1d0);
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

const StackTrace::StackFrame &at(std::size_t position) const
    {
        if(position<(backtraceSize_-cFramesToSkip))
        {
            return frames_[position];
        }
        std::stringstream msg;
        msg << "StackFrame::at: Position "<<position
            << " is out of range: 0 and "<<size();
        throw std::out_of_range(msg.str());
        //make compiler happy
        return frames_[0];
    }